

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaDec.cpp
# Opt level: O0

SRes crnlib::LzmaDec_Allocate(CLzmaDec *p,Byte *props,uint propsSize,ISzAlloc *alloc)

{
  ulong uVar1;
  Byte *pBVar2;
  int __result___1;
  int __result__;
  SizeT dicBufSize;
  CLzmaProps propNew;
  ISzAlloc *alloc_local;
  uint propsSize_local;
  Byte *props_local;
  CLzmaDec *p_local;
  
  propNew._8_8_ = alloc;
  p_local._4_4_ = LzmaProps_Decode((CLzmaProps *)&dicBufSize,props,propsSize);
  if ((p_local._4_4_ == 0) &&
     (p_local._4_4_ = LzmaDec_AllocateProbs2(p,(CLzmaProps *)&dicBufSize,(ISzAlloc *)propNew._8_8_),
     p_local._4_4_ == 0)) {
    uVar1 = (ulong)propNew.lp;
    if ((p->dic == (Byte *)0x0) || (uVar1 != p->dicBufSize)) {
      LzmaDec_FreeDict(p,(ISzAlloc *)propNew._8_8_);
      pBVar2 = (Byte *)(**(code **)propNew._8_8_)(propNew._8_8_,uVar1);
      p->dic = pBVar2;
      if (p->dic == (Byte *)0x0) {
        LzmaDec_FreeProbs(p,(ISzAlloc *)propNew._8_8_);
        return 2;
      }
    }
    p->dicBufSize = uVar1;
    (p->prop).lc = (undefined4)dicBufSize;
    (p->prop).lp = dicBufSize._4_4_;
    (p->prop).pb = propNew.lc;
    (p->prop).dicSize = propNew.lp;
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

SRes LzmaDec_Allocate(CLzmaDec* p, const Byte* props, unsigned propsSize, ISzAlloc* alloc) {
  CLzmaProps propNew;
  SizeT dicBufSize;
  RINOK(LzmaProps_Decode(&propNew, props, propsSize));
  RINOK(LzmaDec_AllocateProbs2(p, &propNew, alloc));
  dicBufSize = propNew.dicSize;
  if (p->dic == 0 || dicBufSize != p->dicBufSize) {
    LzmaDec_FreeDict(p, alloc);
    p->dic = (Byte*)alloc->Alloc(alloc, dicBufSize);
    if (p->dic == 0) {
      LzmaDec_FreeProbs(p, alloc);
      return SZ_ERROR_MEM;
    }
  }
  p->dicBufSize = dicBufSize;
  p->prop = propNew;
  return SZ_OK;
}